

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputAESEncodeStream.cpp
# Opt level: O0

void __thiscall
OutputAESEncodeStream::OutputAESEncodeStream
          (OutputAESEncodeStream *this,IByteWriterWithPosition *inTargetStream,
          ByteList *inEncryptionKey,bool inOwnsStream)

{
  bool bVar1;
  size_type sVar2;
  uchar *puVar3;
  reference puVar4;
  _Self local_50;
  long local_48;
  size_t i;
  const_iterator it;
  bool inOwnsStream_local;
  ByteList *inEncryptionKey_local;
  IByteWriterWithPosition *inTargetStream_local;
  OutputAESEncodeStream *this_local;
  
  IByteWriterWithPosition::IByteWriterWithPosition(&this->super_IByteWriterWithPosition);
  (this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter =
       (_func_int **)&PTR__OutputAESEncodeStream_0054e5b0;
  AESencrypt::AESencrypt(&this->mEncrypt);
  this->mTargetStream = inTargetStream;
  this->mOwnsStream = inOwnsStream;
  if (this->mTargetStream != (IByteWriterWithPosition *)0x0) {
    this->mInIndex = this->mIn;
    sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size(inEncryptionKey)
    ;
    puVar3 = (uchar *)operator_new__(sVar2);
    this->mEncryptionKey = puVar3;
    sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size(inEncryptionKey)
    ;
    this->mEncryptionKeyLength = sVar2;
    i = (size_t)std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (inEncryptionKey);
    local_48 = 0;
    while( true ) {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::end(inEncryptionKey);
      bVar1 = std::operator!=((_Self *)&i,&local_50);
      if (!bVar1) break;
      puVar4 = std::_List_const_iterator<unsigned_char>::operator*
                         ((_List_const_iterator<unsigned_char> *)&i);
      this->mEncryptionKey[local_48] = *puVar4;
      local_48 = local_48 + 1;
      std::_List_const_iterator<unsigned_char>::operator++
                ((_List_const_iterator<unsigned_char> *)&i);
    }
    AESencrypt::key(&this->mEncrypt,this->mEncryptionKey,(int)this->mEncryptionKeyLength);
    this->mWroteIV = false;
  }
  return;
}

Assistant:

OutputAESEncodeStream::OutputAESEncodeStream(IByteWriterWithPosition* inTargetStream, const ByteList& inEncryptionKey, bool inOwnsStream) 
{
	mTargetStream = inTargetStream;
	mOwnsStream = inOwnsStream;

	if (!mTargetStream)
		return;

	mInIndex = mIn;

	// convert inEncryptionKey to internal rep and init encrypt [let's hope its 16...]
	mEncryptionKey = new unsigned char[inEncryptionKey.size()];
	mEncryptionKeyLength = inEncryptionKey.size();
	ByteList::const_iterator it = inEncryptionKey.begin();
	size_t i = 0;
	for (; it != inEncryptionKey.end(); ++i, ++it)
		mEncryptionKey[i] = *it;
	mEncrypt.key(mEncryptionKey, mEncryptionKeyLength);
	
	mWroteIV = false;

}